

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O1

void __thiscall Shell::EqualityProxy::addCongruenceAxioms(EqualityProxy *this,UnitList **units)

{
  Symbol *pSVar1;
  UnitList *pUVar2;
  undefined8 uVar3;
  uint uVar4;
  ulong uVar5;
  OperatorType *pOVar6;
  Term *this_00;
  Term *pTVar7;
  Literal *pLVar8;
  Clause *pCVar9;
  UnitList *pUVar10;
  TermList *result;
  ulong uVar11;
  TermList srt;
  LiteralStack local_108;
  EqualityProxy *local_e0;
  FixedSizeAllocator<16UL> *local_d8;
  undefined1 local_d0 [16];
  Unit *local_c0;
  Stack<Kernel::TermList> local_b8;
  Stack<Kernel::TermList> local_98;
  ulong local_70;
  undefined1 local_68 [16];
  Term *local_58;
  
  local_98._cursor = (TermList *)0x0;
  local_98._end = (TermList *)0x0;
  local_98._capacity = 0;
  local_98._stack = (TermList *)0x0;
  local_b8._cursor = (TermList *)0x0;
  local_b8._end = (TermList *)0x0;
  local_b8._capacity = 0;
  local_b8._stack = (TermList *)0x0;
  local_108._cursor = (Literal **)0x0;
  local_108._end = (Literal **)0x0;
  local_108._capacity = 0;
  local_108._stack = (Literal **)0x0;
  local_d0._0_8_ = (_func_int **)0x2;
  uVar5 = *(long *)(DAT_00b7e1b0 + 0x68) - *(long *)(DAT_00b7e1b0 + 0x60);
  local_e0 = this;
  if ((uVar5 & 0x7fffffff8) != 0) {
    uVar5 = uVar5 >> 3 & 0xffffffff;
    uVar11 = 0;
    local_d8 = (FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
    local_70 = uVar5;
    do {
      pSVar1 = *(Symbol **)(*(long *)(DAT_00b7e1b0 + 0x60) + uVar11 * 8);
      if ((pSVar1->_usageCount != 0) && ((pSVar1->field_0x42 & 4) == 0)) {
        uVar4 = pSVar1->_arity;
        pOVar6 = Kernel::Signature::Symbol::fnType(pSVar1);
        if (uVar4 != 0) {
          getArgumentEqualityLiterals(local_e0,uVar4,&local_108,&local_98,&local_b8,pOVar6);
          this_00 = Kernel::Term::create((uint)uVar11,uVar4,local_98._stack);
          pTVar7 = Kernel::Term::create((uint)uVar11,uVar4,local_b8._stack);
          Kernel::SortHelper::tryGetResultSort((SortHelper *)this_00,(Term *)local_d0,result);
          uVar3 = local_d0._0_8_;
          uVar4 = getProxyPredicate(local_e0);
          local_68._0_8_ = uVar3;
          local_68._8_8_ = this_00;
          local_58 = pTVar7;
          pLVar8 = Kernel::Literal::create(uVar4,3,true,(TermList *)local_68);
          if (local_108._cursor == local_108._end) {
            ::Lib::Stack<Kernel::Literal_*>::expand(&local_108);
          }
          *local_108._cursor = pLVar8;
          local_108._cursor = local_108._cursor + 1;
          local_c0 = local_e0->_defUnit;
          local_d0[8] = 0x6f;
          Kernel::Inference::Inference
                    ((Inference *)local_68,(NonspecificInference1 *)(local_d0 + 8));
          pCVar9 = Kernel::Clause::fromStack(&local_108,(Inference *)local_68);
          pUVar2 = *units;
          pUVar10 = (UnitList *)::Lib::FixedSizeAllocator<16UL>::alloc(local_d8);
          pUVar10->_head = &pCVar9->super_Unit;
          pUVar10->_tail = pUVar2;
          *units = pUVar10;
          uVar5 = local_70;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
  }
  uVar5 = *(long *)(DAT_00b7e1b0 + 0x88) - *(long *)(DAT_00b7e1b0 + 0x80);
  if ((uVar5 & 0x7fffffff0) != 0) {
    uVar11 = 1;
    local_d8 = (FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
    do {
      pSVar1 = *(Symbol **)(*(long *)(DAT_00b7e1b0 + 0x80) + uVar11 * 8);
      if (((pSVar1->_usageCount != 0) && ((pSVar1->field_0x42 & 4) == 0)) &&
         (uVar4 = pSVar1->_arity, uVar4 != 0)) {
        pOVar6 = Kernel::Signature::Symbol::predType(pSVar1);
        getArgumentEqualityLiterals(local_e0,uVar4,&local_108,&local_98,&local_b8,pOVar6);
        pLVar8 = Kernel::Literal::create((uint)uVar11,uVar4,false,local_98._stack);
        if (local_108._cursor == local_108._end) {
          ::Lib::Stack<Kernel::Literal_*>::expand(&local_108);
        }
        *local_108._cursor = pLVar8;
        local_108._cursor = local_108._cursor + 1;
        pLVar8 = Kernel::Literal::create((uint)uVar11,uVar4,true,local_b8._stack);
        if (local_108._cursor == local_108._end) {
          ::Lib::Stack<Kernel::Literal_*>::expand(&local_108);
        }
        *local_108._cursor = pLVar8;
        local_108._cursor = local_108._cursor + 1;
        local_c0 = local_e0->_defUnit;
        local_d0[8] = 0x6f;
        Kernel::Inference::Inference((Inference *)local_68,(NonspecificInference1 *)(local_d0 + 8));
        pCVar9 = Kernel::Clause::fromStack(&local_108,(Inference *)local_68);
        pUVar2 = *units;
        pUVar10 = (UnitList *)::Lib::FixedSizeAllocator<16UL>::alloc(local_d8);
        pUVar10->_head = &pCVar9->super_Unit;
        pUVar10->_tail = pUVar2;
        *units = pUVar10;
      }
      uVar11 = uVar11 + 1;
    } while ((uVar5 >> 3 & 0xffffffff) != uVar11);
  }
  if (local_108._stack != (Literal **)0x0) {
    uVar5 = local_108._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      *local_108._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_108._stack;
    }
    else if (uVar5 < 0x11) {
      *local_108._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_108._stack;
    }
    else if (uVar5 < 0x19) {
      *local_108._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_108._stack;
    }
    else if (uVar5 < 0x21) {
      *local_108._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_108._stack;
    }
    else if (uVar5 < 0x31) {
      *local_108._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_108._stack;
    }
    else if (uVar5 < 0x41) {
      *local_108._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_108._stack;
    }
    else {
      operator_delete(local_108._stack,0x10);
    }
  }
  if ((anon_union_8_2_f154dc0f_for_Term_10)local_b8._stack !=
      (anon_union_8_2_f154dc0f_for_Term_10)0x0) {
    uVar5 = local_b8._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      *local_b8._stack = (TermList)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_b8._stack;
    }
    else if (uVar5 < 0x11) {
      *local_b8._stack = (TermList)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_b8._stack;
    }
    else if (uVar5 < 0x19) {
      *local_b8._stack = (TermList)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_b8._stack;
    }
    else if (uVar5 < 0x21) {
      *local_b8._stack = (TermList)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_b8._stack;
    }
    else if (uVar5 < 0x31) {
      *local_b8._stack = (TermList)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_b8._stack;
    }
    else if (uVar5 < 0x41) {
      *local_b8._stack = (TermList)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_b8._stack;
    }
    else {
      operator_delete(local_b8._stack,0x10);
    }
  }
  if (local_98._stack != (TermList *)0x0) {
    uVar5 = local_98._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_98._stack;
    }
    else if (uVar5 < 0x11) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_98._stack;
    }
    else if (uVar5 < 0x19) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_98._stack;
    }
    else if (uVar5 < 0x21) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_98._stack;
    }
    else if (uVar5 < 0x31) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_98._stack;
    }
    else if (uVar5 < 0x41) {
      (local_98._stack)->_content = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_98._stack;
    }
    else {
      operator_delete(local_98._stack,0x10);
    }
  }
  return;
}

Assistant:

void EqualityProxy::addCongruenceAxioms(UnitList*& units)
{
  // This is Krystof Hoder's comment:
  // TODO: skip UPDR predicates!!!
  Stack<TermList> vars1;
  Stack<TermList> vars2;
  LiteralStack lits;
  TermList srt;

  unsigned funs = env.signature->functions();
  for (unsigned i=0; i<funs; i++) {
    Signature::Symbol* fnSym = env.signature->getFunction(i);
    // can axiomatise equality _before_ preprocessing, so skip (some) introduced symbols
    if(!fnSym->usageCnt() || fnSym->skipCongruence())
      continue;
    unsigned arity = fnSym->arity();
    OperatorType* fnType = fnSym->fnType();
    if (arity == 0) {
      continue;
    }
    getArgumentEqualityLiterals(arity, lits, vars1, vars2, fnType);
    Term* t1 = Term::create(i, arity, vars1.begin());
    Term* t2 = Term::create(i, arity, vars2.begin());
    SortHelper::tryGetResultSort(t1, srt);
    lits.push(makeProxyLiteral(true, TermList(t1), TermList(t2), srt));

    Clause* cl = createEqProxyAxiom(lits);
    UnitList::push(cl,units);
  }

  unsigned preds = env.signature->predicates();
  for (unsigned i = 1; i < preds; i++) {
    Signature::Symbol* predSym = env.signature->getPredicate(i);
    // can axiomatise equality _before_ preprocessing, so skip (some) introduced symbols
    if(!predSym->usageCnt() || predSym->skipCongruence())
      continue;
    unsigned arity = predSym->arity();
    if (arity == 0) {
      continue;
    }
    getArgumentEqualityLiterals(arity, lits, vars1, vars2, predSym->predType());
    lits.push(Literal::create(i, arity, false, vars1.begin()));
    lits.push(Literal::create(i, arity, true, vars2.begin()));

    Clause* cl = createEqProxyAxiom(lits);
    UnitList::push(cl,units);
  }
}